

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444.c
# Opt level: O0

uint8_t rfc5497_timetlv_get_from_vector(uint8_t *vector,size_t vector_length,uint8_t hopcount)

{
  ulong local_30;
  size_t i;
  uint8_t hopcount_local;
  size_t vector_length_local;
  uint8_t *vector_local;
  
  if ((vector_length & 1) == 0) {
    vector_local._7_1_ = 0xff;
  }
  else {
    for (local_30 = 1; local_30 < vector_length; local_30 = local_30 + 2) {
      if (hopcount <= vector[local_30]) {
        return vector[local_30 - 1];
      }
    }
    vector_local._7_1_ = vector[local_30 - 1];
  }
  return vector_local._7_1_;
}

Assistant:

uint8_t
rfc5497_timetlv_get_from_vector(const uint8_t *vector, size_t vector_length, uint8_t hopcount) {
  size_t i;

  /* handle illegal vector length */
  if ((vector_length & 1) == 0) {
    /* return infinite value */
    return 255;
  }

  for (i = 1; i < vector_length; i += 2) {
    /* find our position in the vector */
    if (hopcount <= vector[i]) {
      return vector[i - 1];
    }
  }

  /* use the last field of the vector */
  return vector[i - 1];
}